

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O3

void ArgmaxTask::run(search *sch,multi_ex *ec)

{
  pointer ppeVar1;
  float *pfVar2;
  float fVar3;
  pointer ppeVar4;
  stringstream *psVar5;
  long lVar6;
  ulong uVar7;
  float fVar8;
  long lVar9;
  float fVar10;
  uint32_t oracle;
  ptag local_38;
  float local_34;
  
  ppeVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar1 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  fVar10 = 0.0;
  lVar6 = (long)ppeVar1 - (long)ppeVar4;
  if (lVar6 != 0) {
    pfVar2 = (float *)sch->task_data;
    lVar6 = lVar6 >> 3;
    fVar10 = 1.4013e-45;
    lVar9 = 0;
    do {
      fVar8 = (float)(ppeVar4[lVar9]->l).multi.label;
      if ((uint)fVar10 < (uint)fVar8) {
        fVar10 = fVar8;
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar9);
    local_38 = 0;
    fVar8 = 1.4013e-45;
    if (ppeVar1 != ppeVar4) {
      uVar7 = 0;
      do {
        local_34 = fVar10;
        if (*(char *)(pfVar2 + 2) == '\0') {
          local_34 = (ppeVar4[uVar7]->l).simple.label;
        }
        fVar3 = (float)Search::search::predict
                                 (sch,ppeVar4[uVar7],(int)uVar7 + 1,(action *)&local_34,1,&local_38,
                                  "p",(action *)0x0,0,(float *)0x0,0,0.0);
        if ((uint)fVar8 < (uint)fVar3) {
          fVar8 = fVar3;
        }
        local_38 = local_38 + 1;
        uVar7 = (ulong)local_38;
        ppeVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar7 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppeVar4 >> 3
                              ));
    }
    if ((uint)fVar8 < (uint)fVar10) {
      fVar10 = *pfVar2 / pfVar2[1];
    }
    else if ((uint)fVar10 < (uint)fVar8) {
      fVar10 = 1.0;
    }
    else {
      fVar10 = 0.0;
    }
  }
  Search::search::loss(sch,fVar10);
  psVar5 = Search::search::output_abi_cxx11_(sch);
  if (*(int *)(psVar5 + *(long *)(*(long *)psVar5 + -0x18) + 0x20) == 0) {
    psVar5 = Search::search::output_abi_cxx11_(sch);
    std::ostream::_M_insert<unsigned_long>((ulong)(psVar5 + 0x10));
  }
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data& D = *sch.get_task_data<task_data>();
  uint32_t max_prediction = 1;
  uint32_t max_label = 1;

  for (size_t i = 0; i < ec.size(); i++) max_label = max(ec[i]->l.multi.label, max_label);

  for (ptag i = 0; i < ec.size(); i++)
  {
    // labels should be 1 or 2, and our output is MAX of all predicted values
    uint32_t oracle = D.predict_max ? max_label : ec[i]->l.multi.label;
    uint32_t prediction = sch.predict(*ec[i], i + 1, &oracle, 1, &i, "p");

    max_prediction = max(prediction, max_prediction);
  }
  float loss = 0.;
  if (max_label > max_prediction)
    loss = D.false_negative_cost / D.negative_weight;
  else if (max_prediction > max_label)
    loss = 1.;
  sch.loss(loss);

  if (sch.output().good())
    sch.output() << max_prediction;
}